

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

bool CLI::detail::valid_alias_name_string(string *str)

{
  int iVar1;
  long lVar2;
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  string *local_10;
  string *str_local;
  
  local_10 = str;
  if (valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&valid_alias_name_string(std::__cxx11::string_const&)::
                                 badChars_abi_cxx11_);
    if (iVar1 != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_30,"\n",&local_31);
      ::std::operator+(&valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_,
                       &local_30,'\0');
      ::std::__cxx11::string::~string((string *)&local_30);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
      __cxa_atexit(::std::__cxx11::string::~string,
                   &valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_
                         );
    }
  }
  lVar2 = ::std::__cxx11::string::find_first_of((string *)local_10,0x2af248);
  return lVar2 == -1;
}

Assistant:

inline bool valid_alias_name_string(const std::string &str) {
    static const std::string badChars(std::string("\n") + '\0');
    return (str.find_first_of(badChars) == std::string::npos);
}